

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

reference __thiscall
absl::container_internal::
btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
::operator*(btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
            *this)

{
  byte bVar1;
  template_ElementType<3UL> *ptVar2;
  int iVar3;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *this_00;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  
  this_00 = this->node_;
  if (this_00 ==
      (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
       *)0x0) {
    operator*::anon_class_1_0_00000001::operator()(&local_11);
    this_00 = this->node_;
  }
  bVar1 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::start(this_00);
  if (this->position_ < (int)(uint)bVar1) {
    operator*::anon_class_1_0_00000001::operator()(&local_12);
  }
  bVar1 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::finish(this->node_);
  iVar3 = this->position_;
  if ((int)(uint)bVar1 <= iVar3) {
    operator*::anon_class_1_0_00000001::operator()(&local_13);
    iVar3 = this->position_;
  }
  ptVar2 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           ::GetField<3ul>((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                            *)this->node_);
  return ptVar2 + iVar3;
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    ABSL_HARDENING_ASSERT(node_->start() <= position_);
    ABSL_HARDENING_ASSERT(node_->finish() > position_);
    assert_valid_generation();
    return node_->value(position_);
  }